

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

QWidget * __thiscall QWidget::grab(QWidget *this,QRect *rectangle)

{
  uint uVar1;
  bool bVar2;
  byte bVar3;
  int iVar4;
  QWidgetPrivate *pQVar5;
  QSize targetOffset;
  undefined8 *in_RDX;
  QWidget *in_RSI;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  double dVar6;
  qreal dpr;
  bool oldDirtyOpaqueChildren;
  QWidgetPrivate *d;
  QPixmap *res;
  QRect r;
  RenderFlags renderFlags;
  QRect *in_stack_fffffffffffffee8;
  QWidgetPrivate *in_stack_fffffffffffffef0;
  QWidget *target;
  QRegion in_stack_ffffffffffffff50;
  QWidgetPrivate *in_stack_ffffffffffffff58;
  QPaintDevice *in_stack_ffffffffffffff68;
  QWidgetPrivate *in_stack_ffffffffffffff70;
  QSize local_74 [2];
  QRegion local_50;
  QRegion local_48;
  undefined1 local_40 [16];
  undefined1 local_30 [16];
  QFlagsStorageHelper<QWidget::RenderFlag,_4> local_20;
  QFlagsStorageHelper<QWidget::RenderFlag,_4> local_1c;
  QColor local_18;
  long lVar7;
  
  lVar7 = *(long *)(in_FS_OFFSET + 0x28);
  target = in_RDI;
  pQVar5 = d_func((QWidget *)0x36f5b7);
  bVar2 = testAttribute(in_RDI,(WidgetAttribute)((ulong)in_stack_fffffffffffffef0 >> 0x20));
  if ((bVar2) ||
     (bVar2 = testAttribute(in_RDI,(WidgetAttribute)((ulong)in_stack_fffffffffffffef0 >> 0x20)),
     !bVar2)) {
    sendResizeEvents(target);
  }
  local_1c.super_QFlagsStorage<QWidget::RenderFlag>.i =
       (QFlagsStorage<QWidget::RenderFlag>)0xaaaaaaaa;
  local_20.super_QFlagsStorage<QWidget::RenderFlag>.i =
       (QFlagsStorage<QWidget::RenderFlag>)
       ::operator|((enum_type)((ulong)in_stack_fffffffffffffef0 >> 0x20),
                   (enum_type)in_stack_fffffffffffffef0);
  local_1c.super_QFlagsStorage<QWidget::RenderFlag>.i =
       (QFlagsStorage<QWidget::RenderFlag>)
       QFlags<QWidget::RenderFlag>::operator|
                 ((QFlags<QWidget::RenderFlag> *)in_stack_fffffffffffffef0,
                  (RenderFlag)((ulong)in_stack_fffffffffffffee8 >> 0x20));
  uVar1 = *(uint *)&pQVar5->field_0x250;
  local_30._0_8_ = *in_RDX;
  local_30._8_8_ = in_RDX[1];
  iVar4 = QRect::width(in_stack_fffffffffffffee8);
  if ((iVar4 < 0) || (iVar4 = QRect::height(in_stack_fffffffffffffee8), iVar4 < 0)) {
    in_stack_fffffffffffffef0 = pQVar5;
    QRegion::QRegion(&local_50);
    QWidgetPrivate::prepareToRender
              (in_stack_ffffffffffffff58,(QRegion *)in_stack_ffffffffffffff50.d,
               (QFlagsStorageHelper<QWidget::RenderFlag,_4>)local_74[2].wd.m_i);
    local_40 = QRegion::boundingRect();
    local_30 = local_40;
    QRegion::~QRegion(&local_48);
    QRegion::~QRegion(&local_50);
    QRect::topLeft(in_stack_fffffffffffffee8);
    QRect::setTopLeft((QRect *)target,(QPoint *)in_RDI);
  }
  rect(in_RSI);
  bVar3 = QRect::intersects((QRect *)local_30);
  if (((bVar3 ^ 0xff) & 1) == 0) {
    dVar6 = (double)QPaintDevice::devicePixelRatio();
    *(undefined1 **)in_RDI = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&in_RDI->field_0x8 = &DAT_aaaaaaaaaaaaaaaa;
    *(undefined1 **)&in_RDI->super_QPaintDevice = &DAT_aaaaaaaaaaaaaaaa;
    targetOffset = QRect::size((QRect *)target);
    QSizeF::QSizeF((QSizeF *)in_stack_fffffffffffffef0,(QSize *)in_stack_fffffffffffffee8);
    ::operator*((QSizeF *)in_RDI,(qreal)in_stack_fffffffffffffef0);
    local_74[0] = QSizeF::toSize((QSizeF *)target);
    QPixmap::QPixmap((QPixmap *)in_RDI,(QSize *)local_74);
    QPixmap::setDevicePixelRatio(dVar6);
    if ((*(uint *)&pQVar5->field_0x250 >> 0x11 & 1) == 0) {
      QColor::QColor(&local_18,transparent);
      QPixmap::fill((QColor *)in_RDI);
    }
    QPoint::QPoint((QPoint *)in_stack_fffffffffffffef0);
    QRegion::QRegion((QRegion *)&stack0xffffffffffffff50,(QRect *)local_30,Rectangle);
    QWidgetPrivate::render
              (in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,(QPoint *)targetOffset,
               (QRegion *)in_stack_ffffffffffffff58,
               (QFlagsStorageHelper<QWidget::RenderFlag,_4>)SUB84((ulong)lVar7 >> 0x20,0));
    QRegion::~QRegion((QRegion *)&stack0xffffffffffffff50);
    *(uint *)&pQVar5->field_0x250 =
         *(uint *)&pQVar5->field_0x250 & 0xfffeffff | (uint)((uVar1 >> 0x10 & 1) != 0) << 0x10;
  }
  else {
    QPixmap::QPixmap((QPixmap *)in_RDI);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar7) {
    __stack_chk_fail();
  }
  return target;
}

Assistant:

QPixmap QWidget::grab(const QRect &rectangle)
{
    Q_D(QWidget);
    if (testAttribute(Qt::WA_PendingResizeEvent) || !testAttribute(Qt::WA_WState_Created))
        sendResizeEvents(this);

    const QWidget::RenderFlags renderFlags = QWidget::DrawWindowBackground | QWidget::DrawChildren | QWidget::IgnoreMask;

    const bool oldDirtyOpaqueChildren =  d->dirtyOpaqueChildren;
    QRect r(rectangle);
    if (r.width() < 0 || r.height() < 0) {
        // For grabbing widgets that haven't been shown yet,
        // we trigger the layouting mechanism to determine the widget's size.
        r = d->prepareToRender(QRegion(), renderFlags).boundingRect();
        r.setTopLeft(rectangle.topLeft());
    }

    if (!r.intersects(rect()))
        return QPixmap();

    const qreal dpr = devicePixelRatio();
    QPixmap res((QSizeF(r.size()) * dpr).toSize());
    res.setDevicePixelRatio(dpr);
    if (!d->isOpaque)
        res.fill(Qt::transparent);
    d->render(&res, QPoint(), QRegion(r), renderFlags);

    d->dirtyOpaqueChildren = oldDirtyOpaqueChildren;
    return res;
}